

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

SoapySDRRange *
SoapySDRDevice_getFrequencyRangeComponent
          (SoapySDRDevice *device,int direction,size_t channel,char *name,size_t *length)

{
  char *in_RCX;
  vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> *in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  undefined8 *in_R8;
  exception *ex;
  size_t *in_stack_ffffffffffffff78;
  RangeList *in_stack_ffffffffffffff80;
  allocator local_69;
  string local_68 [32];
  undefined1 local_48 [32];
  char *local_28;
  vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> *local_20;
  undefined4 local_14;
  long *local_10;
  SoapySDRRange *local_8;
  
  *in_R8 = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  SoapySDRDevice_clearError();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,local_28,&local_69);
  (**(code **)(*local_10 + 0x1e8))(local_48,local_10,local_14,local_20,local_68);
  local_8 = toRangeList(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::~vector(local_20);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return local_8;
}

Assistant:

SoapySDRRange *SoapySDRDevice_getFrequencyRangeComponent(const SoapySDRDevice *device, const int direction, const size_t channel, const char *name, size_t *length)
{
    *length = 0;
    __SOAPY_SDR_C_TRY
    return toRangeList(device->getFrequencyRange(direction, channel, name), length);
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}